

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns.c
# Opt level: O0

float WindowingEnergy(float *window,float *data,size_t length,float *data_windowed)

{
  float local_34;
  ulong uStack_30;
  float energy;
  size_t i;
  float *data_windowed_local;
  size_t length_local;
  float *data_local;
  float *window_local;
  
  local_34 = 0.0;
  for (uStack_30 = 0; uStack_30 < length; uStack_30 = uStack_30 + 1) {
    data_windowed[uStack_30] = window[uStack_30] * data[uStack_30];
    local_34 = data_windowed[uStack_30] * data_windowed[uStack_30] + local_34;
  }
  return local_34;
}

Assistant:

static float WindowingEnergy(const float *window, const float *data, size_t length, float *data_windowed) {
    size_t i;
    float energy = 0.f;
    for (i = 0; i < length; ++i) {
        data_windowed[i] = window[i] * data[i];
        energy += data_windowed[i] * data_windowed[i];
    }
    return energy;
}